

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O1

void Gia_ManFilterEquivsUsingLatches
               (Gia_Man_t *pGia,int fFlopsOnly,int fFlopsWith,int fUseRiDrivers)

{
  int iVar1;
  int iVar2;
  Gia_Rpr_t GVar3;
  uint uVar4;
  uint uVar5;
  Vec_Int_t *pVVar6;
  bool bVar7;
  int iVar8;
  Vec_Int_t *p;
  int *piVar9;
  void *__s;
  long lVar10;
  uint *puVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  
  if (fFlopsOnly == fFlopsWith) {
    __assert_fail("fFlopsOnly ^ fFlopsWith",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                  ,0x9c1,"void Gia_ManFilterEquivsUsingLatches(Gia_Man_t *, int, int, int)");
  }
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar9 = (int *)malloc(400);
  p->pArray = piVar9;
  iVar1 = pGia->nObjs;
  iVar8 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar8 = iVar1;
  }
  if (iVar8 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar8 << 2);
  }
  if (__s != (void *)0x0) {
    memset(__s,0,(long)iVar1 * 4);
  }
  iVar8 = pGia->nRegs;
  if (fUseRiDrivers == 0) {
    if (0 < iVar8) {
      pVVar6 = pGia->vCis;
      iVar8 = -iVar8;
      do {
        iVar2 = pVVar6->nSize;
        uVar15 = iVar8 + iVar2;
        if (((int)uVar15 < 0) || (iVar2 <= (int)uVar15)) goto LAB_0020415a;
        iVar2 = pVVar6->pArray[uVar15];
        if (((long)iVar2 < 0) || (pGia->nObjs <= iVar2)) goto LAB_00204198;
        if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
        if (iVar1 <= iVar2) goto LAB_002041b7;
        *(undefined4 *)((long)__s + (long)iVar2 * 4) = 1;
        iVar8 = iVar8 + 1;
      } while (iVar8 != 0);
    }
  }
  else if (0 < iVar8) {
    pVVar6 = pGia->vCos;
    iVar8 = -iVar8;
    do {
      iVar2 = pVVar6->nSize;
      uVar15 = iVar8 + iVar2;
      if (((int)uVar15 < 0) || (iVar2 <= (int)uVar15)) goto LAB_0020415a;
      iVar2 = pVVar6->pArray[uVar15];
      if (((long)iVar2 < 0) || (pGia->nObjs <= iVar2)) {
LAB_00204198:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
      uVar15 = iVar2 - (*(uint *)(pGia->pObjs + iVar2) & 0x1fffffff);
      if (((int)uVar15 < 0) || (iVar1 <= (int)uVar15)) {
LAB_002041b7:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      *(undefined4 *)((long)__s + (ulong)uVar15 * 4) = 1;
      iVar8 = iVar8 + 1;
    } while (iVar8 != 0);
  }
  uVar14 = 0;
  uVar15 = 0;
  if (1 < pGia->nObjs) {
    uVar15 = 0;
    lVar10 = 1;
    uVar14 = 0;
    do {
      GVar3 = pGia->pReprs[lVar10];
      if (((uint)GVar3 & 0xfffffff) == 0) {
        if (pGia->pNexts[lVar10] != 0) {
          __assert_fail("pGia->pNexts[i] == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                        ,0x9d3,"void Gia_ManFilterEquivsUsingLatches(Gia_Man_t *, int, int, int)");
        }
        if (iVar1 <= lVar10) {
LAB_0020415a:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar14 = uVar14 + 1;
        if (*(int *)((long)__s + lVar10 * 4) == 0) {
          pGia->pReprs[lVar10] = (Gia_Rpr_t)((uint)GVar3 | 0xfffffff);
        }
        else {
          uVar15 = uVar15 + 1;
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < pGia->nObjs);
  }
  if (fFlopsOnly == 0) {
    if (1 < pGia->nObjs) {
      uVar13 = 1;
      do {
        if ((((uint)pGia->pReprs[uVar13] & 0xfffffff) == 0xfffffff) && (0 < pGia->pNexts[uVar13])) {
          if (pGia->pNexts[uVar13] < 1) {
            __assert_fail("Gia_ObjIsHead(pGia, i)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                          ,0xa02,"void Gia_ManFilterEquivsUsingLatches(Gia_Man_t *, int, int, int)")
            ;
          }
          uVar14 = uVar14 - 1;
          bVar7 = false;
          uVar12 = uVar13 & 0xffffffff;
          uVar4 = uVar15 - 1;
          uVar16 = uVar15;
          do {
            uVar16 = uVar16 + 1;
            if (iVar1 <= (int)uVar12) goto LAB_0020415a;
            if (*(int *)((long)__s + uVar12 * 4) != 0) {
              bVar7 = true;
            }
            puVar11 = (uint *)(pGia->pNexts + uVar12);
            uVar12 = (ulong)*puVar11;
            uVar15 = uVar4 + 1;
            uVar14 = uVar14 + 1;
            uVar4 = uVar15;
          } while (0 < (int)*puVar11);
          if (!bVar7) {
            puVar11 = (uint *)(pGia->pNexts + uVar13);
            uVar12 = uVar13 & 0xffffffff;
            uVar15 = uVar16;
            do {
              uVar4 = *puVar11;
              pGia->pReprs[(int)uVar12] = (Gia_Rpr_t)((uint)pGia->pReprs[(int)uVar12] | 0xfffffff);
              uVar15 = uVar15 - 1;
              piVar9 = pGia->pNexts;
              piVar9[(int)uVar12] = 0;
              puVar11 = (uint *)(piVar9 + (int)uVar4);
              uVar12 = (ulong)uVar4;
            } while ((long)(int)uVar4 != 0);
            if (((~(uint)pGia->pReprs[uVar13] & 0xfffffff) == 0) && (0 < pGia->pNexts[uVar13])) {
              __assert_fail("!Gia_ObjIsHead(pGia, i)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                            ,0xa16,
                            "void Gia_ManFilterEquivsUsingLatches(Gia_Man_t *, int, int, int)");
            }
          }
        }
        uVar13 = uVar13 + 1;
      } while ((long)uVar13 < (long)pGia->nObjs);
    }
  }
  else if (1 < pGia->nObjs) {
    uVar13 = 1;
    do {
      if ((((uint)pGia->pReprs[uVar13] & 0xfffffff) == 0xfffffff) && (0 < pGia->pNexts[uVar13])) {
        p->nSize = 0;
        if (pGia->pNexts[uVar13] < 1) {
          __assert_fail("Gia_ObjIsHead(pGia, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                        ,0x9df,"void Gia_ManFilterEquivsUsingLatches(Gia_Man_t *, int, int, int)");
        }
        uVar14 = uVar14 - 1;
        uVar12 = uVar13 & 0xffffffff;
        do {
          if (iVar1 <= (int)uVar12) goto LAB_0020415a;
          if (*(int *)((long)__s + uVar12 * 4) != 0) {
            Vec_IntPush(p,(int)uVar12);
          }
          puVar11 = (uint *)(pGia->pNexts + uVar12);
          uVar12 = (ulong)*puVar11;
          uVar14 = uVar14 + 1;
        } while (0 < (int)*puVar11);
        puVar11 = (uint *)(pGia->pNexts + uVar13);
        uVar12 = uVar13 & 0xffffffff;
        do {
          uVar4 = *puVar11;
          pGia->pReprs[(int)uVar12] = (Gia_Rpr_t)((uint)pGia->pReprs[(int)uVar12] | 0xfffffff);
          piVar9 = pGia->pNexts;
          piVar9[(int)uVar12] = 0;
          puVar11 = (uint *)(piVar9 + (int)uVar4);
          uVar12 = (ulong)uVar4;
        } while ((long)(int)uVar4 != 0);
        if (((~(uint)pGia->pReprs[uVar13] & 0xfffffff) == 0) && (0 < pGia->pNexts[uVar13])) {
          __assert_fail("!Gia_ObjIsHead(pGia, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                        ,0x9ed,"void Gia_ManFilterEquivsUsingLatches(Gia_Man_t *, int, int, int)");
        }
        iVar8 = p->nSize;
        if (1 < (long)iVar8) {
          puVar11 = (uint *)p->pArray;
          uVar4 = *puVar11;
          uVar15 = (uVar15 + iVar8) - 1;
          lVar10 = 1;
          uVar16 = uVar4;
          do {
            uVar5 = puVar11[lVar10];
            if ((uVar4 != 0xfffffff) && ((int)uVar5 <= (int)uVar4)) {
              __assert_fail("Num == GIA_VOID || Num < Id",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x400,"void Gia_ObjSetRepr(Gia_Man_t *, int, int)");
            }
            pGia->pReprs[(int)uVar5] =
                 (Gia_Rpr_t)((uint)pGia->pReprs[(int)uVar5] & 0xf0000000 | uVar4 & 0xfffffff);
            pGia->pNexts[(int)uVar16] = uVar5;
            lVar10 = lVar10 + 1;
            uVar16 = uVar5;
          } while (iVar8 != lVar10);
          if (pGia->pNexts[(int)uVar5] != 0) {
            __assert_fail("Gia_ObjNext(pGia, iPrev) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                          ,0x9f9,"void Gia_ManFilterEquivsUsingLatches(Gia_Man_t *, int, int, int)")
            ;
          }
        }
      }
      uVar13 = uVar13 + 1;
    } while ((long)uVar13 < (long)pGia->nObjs);
  }
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
    p->pArray = (int *)0x0;
  }
  free(p);
  if (__s != (void *)0x0) {
    free(__s);
  }
  Abc_Print(1,"The number of literals: Before = %d. After = %d.\n",(ulong)uVar14,(ulong)uVar15);
  return;
}

Assistant:

void Gia_ManFilterEquivsUsingLatches( Gia_Man_t * pGia, int fFlopsOnly, int fFlopsWith, int fUseRiDrivers )
{
    Gia_Obj_t * pObjR;
    Vec_Int_t * vNodes, * vFfIds;
    int i, k, iObj, iNext, iPrev, iRepr;
    int iLitsOld = 0, iLitsNew = 0;
    assert( fFlopsOnly ^ fFlopsWith );
    vNodes = Vec_IntAlloc( 100 );
    // select nodes "flop" node IDs
    vFfIds = Vec_IntStart( Gia_ManObjNum(pGia) );
    if ( fUseRiDrivers )
    {
        Gia_ManForEachRi( pGia, pObjR, i )
            Vec_IntWriteEntry( vFfIds, Gia_ObjFaninId0p(pGia, pObjR), 1 );
    }
    else
    {
        Gia_ManForEachRo( pGia, pObjR, i )
            Vec_IntWriteEntry( vFfIds, Gia_ObjId(pGia, pObjR), 1 );
    }
    // remove all non-flop constants
    Gia_ManForEachConst( pGia, i )
    {
        iLitsOld++;
        assert( pGia->pNexts[i] == 0 );
        if ( !Vec_IntEntry(vFfIds, i) )
            Gia_ObjUnsetRepr( pGia, i );
        else
            iLitsNew++;
    }
    // clear the classes
    if ( fFlopsOnly )
    {
        Gia_ManForEachClass( pGia, i )
        {
            Vec_IntClear( vNodes );
            Gia_ClassForEachObj( pGia, i, iObj )
            {
                if ( Vec_IntEntry(vFfIds, iObj) )
                    Vec_IntPush( vNodes, iObj );
                iLitsOld++;
            }
            iLitsOld--;
            // undo equivalence classes
            for ( iObj = i, iNext = Gia_ObjNext(pGia, iObj); iObj;
                  iObj = iNext, iNext = Gia_ObjNext(pGia, iObj) )
            {
                Gia_ObjUnsetRepr( pGia, iObj );
                Gia_ObjSetNext( pGia, iObj, 0 );
            }
            assert( !Gia_ObjIsHead(pGia, i) );
            if ( Vec_IntSize(vNodes) > 1 )
            {
                // create new class
                iPrev = iRepr = Vec_IntEntry( vNodes, 0 );
                Vec_IntForEachEntryStart( vNodes, iObj, k, 1 )
                {
                    Gia_ObjSetRepr( pGia, iObj, iRepr );
                    Gia_ObjSetNext( pGia, iPrev, iObj );
                    iPrev = iObj;
                    iLitsNew++;
                }
                assert( Gia_ObjNext(pGia, iPrev) == 0 );
            }
        }
    }
    else
    {
        Gia_ManForEachClass( pGia, i )
        {
            int fSeenFlop = 0;
            Gia_ClassForEachObj( pGia, i, iObj )
            {
                if ( Vec_IntEntry(vFfIds, iObj) )
                    fSeenFlop = 1;
                iLitsOld++;
                iLitsNew++;
            }
            iLitsOld--;
            iLitsNew--;
            if ( fSeenFlop )
                continue;
            // undo equivalence classes
            for ( iObj = i, iNext = Gia_ObjNext(pGia, iObj); iObj;
                  iObj = iNext, iNext = Gia_ObjNext(pGia, iObj) )
            {
                Gia_ObjUnsetRepr( pGia, iObj );
                Gia_ObjSetNext( pGia, iObj, 0 );
                iLitsNew--;
            }
            iLitsNew++;
            assert( !Gia_ObjIsHead(pGia, i) );
        }
    }
    Vec_IntFree( vNodes );
    Vec_IntFree( vFfIds );
    Abc_Print( 1, "The number of literals: Before = %d. After = %d.\n", iLitsOld, iLitsNew );
}